

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ExprProcessFuncArguments
                (jx9_gen_state *pGen,jx9_expr_node *pOp,jx9_expr_node **apNode,sxi32 nToken)

{
  sxi32 sVar1;
  sxi32 local_3c;
  sxi32 rc;
  sxi32 iNode;
  sxi32 iCur;
  sxi32 iNest;
  sxi32 nToken_local;
  jx9_expr_node **apNode_local;
  jx9_expr_node *pOp_local;
  jx9_gen_state *pGen_local;
  
  rc = 0;
  do {
    sVar1 = rc;
    if (nToken <= rc) {
      return 0;
    }
    iNode = 0;
    for (; rc < nToken; rc = rc + 1) {
      if (apNode[rc] != (jx9_expr_node *)0x0) {
        if ((((apNode[rc]->pStart->nType & 0x20000) != 0) &&
            (apNode[rc]->pLeft == (jx9_expr_node *)0x0)) && (iNode < 1)) break;
        if ((apNode[rc]->pStart->nType & 0xa40) == 0) {
          if ((apNode[rc]->pStart->nType & 0x1480) != 0) {
            iNode = iNode + -1;
          }
        }
        else {
          iNode = iNode + 1;
        }
      }
    }
    if (rc <= sVar1) {
      local_3c = jx9GenCompileError(pGen,1,pOp->pStart->nLine,"Missing function argument");
      if (local_3c != -10) {
        local_3c = -0xc;
      }
      return local_3c;
    }
    ExprMakeTree(pGen,apNode + sVar1,rc - sVar1);
    if (apNode[sVar1] == (jx9_expr_node *)0x0) {
      local_3c = jx9GenCompileError(pGen,1,pOp->pStart->nLine,"Empty function argument");
      if (local_3c != -10) {
        local_3c = -0xc;
      }
      return local_3c;
    }
    SySetPut(&pOp->aNodeArgs,apNode + sVar1);
    if (((rc < nToken) && (apNode[rc] != (jx9_expr_node *)0x0)) &&
       (((apNode[rc]->pStart->nType & 0x20000) != 0 && (rc = rc + 1, nToken <= rc)))) {
      local_3c = jx9GenCompileError(pGen,1,pOp->pStart->nLine,"Missing function argument");
      if (local_3c != -10) {
        local_3c = -0xc;
      }
      return local_3c;
    }
  } while( true );
}

Assistant:

static sxi32 ExprProcessFuncArguments(jx9_gen_state *pGen, jx9_expr_node *pOp, jx9_expr_node **apNode, sxi32 nToken)
{
	sxi32 iNest, iCur, iNode;
	sxi32 rc;
	/* Process function arguments from left to right */
	iCur = 0;
	for(;;){
		if( iCur >= nToken ){
			/* No more arguments to process */
			break;
		}
		iNode = iCur;
		iNest = 0;
		while( iCur < nToken ){
			if( apNode[iCur] ){
				if( (apNode[iCur]->pStart->nType & JX9_TK_COMMA) && apNode[iCur]->pLeft == 0 && iNest <= 0 ){
					break;
				}else if( apNode[iCur]->pStart->nType & (JX9_TK_LPAREN|JX9_TK_OSB|JX9_TK_OCB) ){
					iNest++;
				}else if( apNode[iCur]->pStart->nType & (JX9_TK_RPAREN|JX9_TK_CCB|JX9_TK_CSB) ){
					iNest--;
				}
			}
			iCur++;
		}
		if( iCur > iNode ){
			ExprMakeTree(&(*pGen), &apNode[iNode], iCur-iNode);
			if( apNode[iNode] ){
				/* Put a pointer to the root of the tree in the arguments set */
				SySetPut(&pOp->aNodeArgs, (const void *)&apNode[iNode]);
			}else{
				/* Empty function argument */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Empty function argument");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
		}else{
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Missing function argument");
			if( rc != SXERR_ABORT ){
				rc = SXERR_SYNTAX;
			}
			return rc;
		}
		/* Jump trailing comma */
		if( iCur < nToken && apNode[iCur] && (apNode[iCur]->pStart->nType & JX9_TK_COMMA) ){
			iCur++;
			if( iCur >= nToken ){
				/* missing function argument */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pOp->pStart->nLine, "Missing function argument");
				if( rc != SXERR_ABORT ){
					rc = SXERR_SYNTAX;
				}
				return rc;
			}
		}
	}
	return SXRET_OK;
}